

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FSDist_COF.cpp
# Opt level: O0

void __thiscall
FSDist_COF::FSDist_COF(FSDist_COF *this,MultiAgentDecisionProcessDiscreteFactoredStatesInterface *a)

{
  undefined8 uVar1;
  vector<double,_std::allocator<double>_> *__n;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  reference pvVar2;
  size_t *psVar3;
  long *in_RSI;
  undefined8 *in_RDI;
  Index i;
  FactoredStateDistribution *in_stack_ffffffffffffff40;
  allocator_type *in_stack_ffffffffffffff48;
  allocator_type *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff58;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffff60;
  uint local_24;
  
  FactoredStateDistribution::FactoredStateDistribution(in_stack_ffffffffffffff40);
  *in_RDI = &PTR__FSDist_COF_00d4d120;
  uVar1 = (**(code **)(*in_RSI + 400))();
  in_RDI[1] = uVar1;
  (**(code **)(*in_RSI + 400))();
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xb079f8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58,(allocator_type *)in_stack_ffffffffffffff50);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xb07a1b);
  (**(code **)(*in_RSI + 400))();
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0xb07a56);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0xb07a79);
  local_24 = 0;
  while( true ) {
    __n = (vector<double,_std::allocator<double>_> *)(ulong)local_24;
    this_00 = (vector<double,_std::allocator<double>_> *)(**(code **)(*in_RSI + 400))();
    if (this_00 <= __n) break;
    this_01 = (vector<double,_std::allocator<double>_> *)
              (**(code **)(*in_RSI + 0x1a8))(in_RSI,local_24);
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 2),
                        (ulong)local_24);
    *pvVar2 = (value_type)this_01;
    in_stack_ffffffffffffff48 = (allocator_type *)(**(code **)(*in_RSI + 0x1a8))(in_RSI,local_24);
    std::allocator<double>::allocator((allocator<double> *)0xb07b3c);
    std::vector<double,_std::allocator<double>_>::vector
              (this_00,(size_type)__n,(value_type_conflict3 *)this_01,in_stack_ffffffffffffff48);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)(in_RDI + 6),(ulong)local_24);
    std::vector<double,_std::allocator<double>_>::operator=
              (this_01,(vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff48);
    std::vector<double,_std::allocator<double>_>::~vector(this_01);
    std::allocator<double>::~allocator((allocator<double> *)0xb07b9b);
    local_24 = local_24 + 1;
  }
  psVar3 = IndexTools::CalculateStepSize
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_ffffffffffffff48);
  in_RDI[5] = psVar3;
  return;
}

Assistant:

FSDist_COF::FSDist_COF(const MultiAgentDecisionProcessDiscreteFactoredStatesInterface& a) :
    _m_nrStateFactors(a.GetNrStateFactors()),
    _m_sfacDomainSizes(a.GetNrStateFactors()),
    _m_probs(a.GetNrStateFactors())
{
    for(Index i=0; i < a.GetNrStateFactors(); i++)
    {
        _m_sfacDomainSizes[i] = a.GetNrValuesForFactor(i);
        _m_probs[i] = vector<double>( a.GetNrValuesForFactor( i ), 0.0 );
    }
    _m_stepSize = IndexTools::CalculateStepSize(_m_sfacDomainSizes);
}